

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_5f811d::NodeArray::printWithComma(NodeArray *this,OutputStream *S)

{
  char *pcVar1;
  Node *pNVar2;
  bool bVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  
  if (this->NumElements != 0) {
    bVar3 = true;
    sVar4 = 0;
    sVar5 = S->CurrentPosition;
    do {
      sVar6 = sVar5;
      if (!bVar3) {
        OutputStream::grow(S,2);
        pcVar1 = S->Buffer;
        sVar6 = S->CurrentPosition;
        (pcVar1 + sVar6)[0] = ',';
        (pcVar1 + sVar6)[1] = ' ';
        sVar6 = S->CurrentPosition + 2;
        S->CurrentPosition = sVar6;
      }
      pNVar2 = this->Elements[sVar4];
      (*pNVar2->_vptr_Node[4])(pNVar2,S);
      if (pNVar2->RHSComponentCache != No) {
        (*pNVar2->_vptr_Node[5])(pNVar2,S);
      }
      sVar7 = S->CurrentPosition;
      if (sVar6 == sVar7) {
        S->CurrentPosition = sVar5;
        sVar7 = sVar5;
      }
      else {
        bVar3 = false;
      }
      sVar4 = sVar4 + 1;
      sVar5 = sVar7;
    } while (sVar4 != this->NumElements);
  }
  return;
}

Assistant:

void printWithComma(OutputStream &S) const {
    bool FirstElement = true;
    for (size_t Idx = 0; Idx != NumElements; ++Idx) {
      size_t BeforeComma = S.getCurrentPosition();
      if (!FirstElement)
        S += ", ";
      size_t AfterComma = S.getCurrentPosition();
      Elements[Idx]->print(S);

      // Elements[Idx] is an empty parameter pack expansion, we should erase the
      // comma we just printed.
      if (AfterComma == S.getCurrentPosition()) {
        S.setCurrentPosition(BeforeComma);
        continue;
      }

      FirstElement = false;
    }
  }